

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_read_decoder_model_info(aom_dec_model_info_t *decoder_model_info,aom_read_bit_buffer *rb)

{
  int iVar1;
  uint32_t uVar2;
  aom_read_bit_buffer *in_RSI;
  uint32_t *in_RDI;
  int in_stack_ffffffffffffffec;
  
  iVar1 = aom_rb_read_literal(in_RSI,in_stack_ffffffffffffffec);
  in_RDI[1] = iVar1 + 1;
  uVar2 = aom_rb_read_unsigned_literal(in_RSI,in_stack_ffffffffffffffec);
  *in_RDI = uVar2;
  iVar1 = aom_rb_read_literal(in_RSI,in_stack_ffffffffffffffec);
  in_RDI[2] = iVar1 + 1;
  iVar1 = aom_rb_read_literal(in_RSI,in_stack_ffffffffffffffec);
  in_RDI[3] = iVar1 + 1;
  return;
}

Assistant:

void av1_read_decoder_model_info(aom_dec_model_info_t *decoder_model_info,
                                 struct aom_read_bit_buffer *rb) {
  decoder_model_info->encoder_decoder_buffer_delay_length =
      aom_rb_read_literal(rb, 5) + 1;
  decoder_model_info->num_units_in_decoding_tick =
      aom_rb_read_unsigned_literal(rb,
                                   32);  // Number of units in a decoding tick
  decoder_model_info->buffer_removal_time_length =
      aom_rb_read_literal(rb, 5) + 1;
  decoder_model_info->frame_presentation_time_length =
      aom_rb_read_literal(rb, 5) + 1;
}